

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_rldnm(DisasContext_conflict10 *ctx,int mb,int me)

{
  TCGContext_conflict10 *tcg_ctx_00;
  TCGv_i64 ret;
  TCGv_i64 arg1;
  TCGv_i64 arg1_00;
  uint32_t uVar1;
  TCGv_i64 ret_00;
  target_ulong arg2;
  TCGv_i64 t0;
  TCGv_i64 t_rb;
  TCGv_i64 t_rs;
  TCGv_i64 t_ra;
  TCGContext_conflict10 *tcg_ctx;
  int me_local;
  int mb_local;
  DisasContext_conflict10 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  uVar1 = rA(ctx->opcode);
  ret = cpu_gpr[uVar1];
  uVar1 = rS(ctx->opcode);
  arg1 = cpu_gpr[uVar1];
  uVar1 = rB(ctx->opcode);
  arg1_00 = cpu_gpr[uVar1];
  ret_00 = tcg_temp_new_i64(tcg_ctx_00);
  tcg_gen_andi_i64_ppc64(tcg_ctx_00,ret_00,arg1_00,0x3f);
  tcg_gen_rotl_i64_ppc64(tcg_ctx_00,ret,arg1,ret_00);
  tcg_temp_free_i64(tcg_ctx_00,ret_00);
  arg2 = MASK((long)mb,(long)me);
  tcg_gen_andi_i64_ppc64(tcg_ctx_00,ret,ret,arg2);
  uVar1 = Rc(ctx->opcode);
  if (uVar1 != 0) {
    gen_set_Rc0(ctx,ret);
  }
  return;
}

Assistant:

static void gen_rldnm(DisasContext *ctx, int mb, int me)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv t_ra = cpu_gpr[rA(ctx->opcode)];
    TCGv t_rs = cpu_gpr[rS(ctx->opcode)];
    TCGv t_rb = cpu_gpr[rB(ctx->opcode)];
    TCGv t0;

    t0 = tcg_temp_new(tcg_ctx);
    tcg_gen_andi_tl(tcg_ctx, t0, t_rb, 0x3f);
    tcg_gen_rotl_tl(tcg_ctx, t_ra, t_rs, t0);
    tcg_temp_free(tcg_ctx, t0);

    tcg_gen_andi_tl(tcg_ctx, t_ra, t_ra, MASK(mb, me));
    if (unlikely(Rc(ctx->opcode) != 0)) {
        gen_set_Rc0(ctx, t_ra);
    }
}